

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,MarketDataRequest *message,SessionID *param_2)

{
  char cVar1;
  int iVar2;
  IncorrectTagValue *this_00;
  uint num;
  allocator<char> local_259;
  SubscriptionRequestType subscriptionRequestType;
  Symbol symbol;
  NoRelatedSym noRelatedSym;
  MarketDepth marketDepth;
  MDReqID mdReqID;
  NoRelatedSym noRelatedSymGroup;
  
  FIX::MDReqID::MDReqID(&mdReqID);
  FIX::SubscriptionRequestType::SubscriptionRequestType(&subscriptionRequestType);
  FIX::MarketDepth::MarketDepth(&marketDepth);
  FIX::NoRelatedSym::NoRelatedSym(&noRelatedSym);
  FIX42::MarketDataRequest::NoRelatedSym::NoRelatedSym(&noRelatedSymGroup);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&mdReqID);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&subscriptionRequestType);
  cVar1 = FIX::CharField::getValue(&subscriptionRequestType.super_CharField);
  if (cVar1 == '0') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&marketDepth);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&noRelatedSym);
    num = 1;
    while( true ) {
      iVar2 = FIX::IntField::getValue(&noRelatedSym.super_NumInGroupField);
      if (iVar2 < (int)num) break;
      FIX::Symbol::Symbol(&symbol);
      FIX::Message::getGroup((Message *)message,num,&noRelatedSymGroup.super_Group);
      FIX::FieldMap::getField(&noRelatedSymGroup.super_Group.super_FieldMap,(FieldBase *)&symbol);
      FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
      num = num + 1;
    }
    FIX::FieldMap::~FieldMap((FieldMap *)&noRelatedSymGroup);
    FIX::FieldBase::~FieldBase((FieldBase *)&noRelatedSym);
    FIX::FieldBase::~FieldBase((FieldBase *)&marketDepth);
    FIX::FieldBase::~FieldBase((FieldBase *)&subscriptionRequestType);
    FIX::FieldBase::~FieldBase((FieldBase *)&mdReqID);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&symbol,"",&local_259);
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,subscriptionRequestType.super_CharField.super_FieldBase.m_tag,(string *)&symbol
            );
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX42::MarketDataRequest &message, const FIX::SessionID &) {
  FIX::MDReqID mdReqID;
  FIX::SubscriptionRequestType subscriptionRequestType;
  FIX::MarketDepth marketDepth;
  FIX::NoRelatedSym noRelatedSym;
  FIX42::MarketDataRequest::NoRelatedSym noRelatedSymGroup;

  message.get(mdReqID);
  message.get(subscriptionRequestType);
  if (subscriptionRequestType != FIX::SubscriptionRequestType_SNAPSHOT) {
    throw FIX::IncorrectTagValue(subscriptionRequestType.getTag());
  }
  message.get(marketDepth);
  message.get(noRelatedSym);

  for (int i = 1; i <= noRelatedSym; ++i) {
    FIX::Symbol symbol;
    message.getGroup(i, noRelatedSymGroup);
    noRelatedSymGroup.get(symbol);
  }
}